

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void nlohmann::adl_serializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::
     from_json(json *aJson,ByteArray *aBuf)

{
  ByteArray *aBuf_00;
  bool bVar1;
  JsonException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Error local_98;
  ErrorCode local_70 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Error local_40;
  ByteArray *local_18;
  ByteArray *aBuf_local;
  json *aJson_local;
  
  local_18 = aBuf;
  aBuf_local = (ByteArray *)aJson;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_60,aJson);
  ot::commissioner::utils::Hex(&local_40,aBuf,&local_60);
  local_70[0] = kNone;
  bVar1 = ot::commissioner::operator!=(&local_40,local_70);
  ot::commissioner::Error::~Error(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    return;
  }
  this = (JsonException *)__cxa_allocate_exception(0x38);
  aBuf_00 = local_18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_b8,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)aBuf_local);
  ot::commissioner::utils::Hex(&local_98,aBuf_00,&local_b8);
  ot::commissioner::JsonException::JsonException(this,&local_98);
  __cxa_throw(this,&ot::commissioner::JsonException::typeinfo,
              ot::commissioner::JsonException::~JsonException);
}

Assistant:

static void from_json(const json &aJson, ot::commissioner::ByteArray &aBuf)
    {
        SuccessOrThrow(::ot::commissioner::utils::Hex(aBuf, aJson.get<std::string>()));
    }